

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_murmurhash.c
# Opt level: O2

uint32_t ngx_murmur_hash2(u_char *data,size_t len)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = len & 0xffffffff;
  do {
    uVar1 = (uint)uVar2;
    switch(len) {
    case 3:
      uVar1 = uVar1 ^ (uint)data[2] << 0x10;
    case 2:
      uVar1 = uVar1 ^ (uint)data[1] << 8;
    case 1:
      uVar1 = (*data ^ uVar1) * 0x5bd1e995;
    case 0:
      uVar1 = (uVar1 >> 0xd ^ uVar1) * 0x5bd1e995;
      return uVar1 >> 0xf ^ uVar1;
    default:
      uVar2 = (ulong)(uVar1 * 0x5bd1e995 ^
                     ((uint)(*(int *)data * 0x5bd1e995) >> 0x18 ^ *(int *)data * 0x5bd1e995) *
                     0x5bd1e995);
      data = data + 4;
      len = len - 4;
    }
  } while( true );
}

Assistant:

uint32_t
ngx_murmur_hash2(u_char *data, size_t len)
{
    uint32_t  h, k;

    h = 0 ^ len;

    while (len >= 4) {
        k  = data[0];
        k |= data[1] << 8;
        k |= data[2] << 16;
        k |= data[3] << 24;

        k *= 0x5bd1e995;
        k ^= k >> 24;
        k *= 0x5bd1e995;

        h *= 0x5bd1e995;
        h ^= k;

        data += 4;
        len -= 4;
    }

    switch (len) {
    case 3:
        h ^= data[2] << 16;
        /* fall through */
    case 2:
        h ^= data[1] << 8;
        /* fall through */
    case 1:
        h ^= data[0];
        h *= 0x5bd1e995;
    }

    h ^= h >> 13;
    h *= 0x5bd1e995;
    h ^= h >> 15;

    return h;
}